

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_5d835d::CastExpr::printLeft(CastExpr *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (this->CastKind).First;
  sVar2 = (long)(this->CastKind).Last - (long)pcVar1;
  if (sVar2 != 0) {
    OutputStream::grow(S,sVar2);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar2);
    S->CurrentPosition = S->CurrentPosition + sVar2;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '<';
  S->CurrentPosition = S->CurrentPosition + 1;
  (*this->To->_vptr_Node[4])(this->To,S);
  OutputStream::grow(S,2);
  pcVar1 = S->Buffer;
  sVar2 = S->CurrentPosition;
  (pcVar1 + sVar2)[0] = '>';
  (pcVar1 + sVar2)[1] = '(';
  S->CurrentPosition = S->CurrentPosition + 2;
  (*this->From->_vptr_Node[4])(this->From,S);
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += CastKind;
    S += "<";
    To->printLeft(S);
    S += ">(";
    From->printLeft(S);
    S += ")";
  }